

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O3

uint64_t helper_iwmmxt_srll_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (x & 0xffffffff) >> ((byte)n & 0x3f);
  uVar2 = x >> ((byte)n & 0x3f);
  (env->iwmmxt).cregs[3] =
       (uint)(uVar2 >> 0x20 == 0) << 0x1e |
       (uint)(uVar1 == 0) << 0xe | (uint)(0x7fffffff < uVar1) << 0xf |
       (uint)(uVar2 >> 0x20) & 0x80000000;
  return uVar2 & 0xffffffff00000000 | uVar1;
}

Assistant:

uint64_t HELPER(iwmmxt_srll)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((x & (0xffffffffll << 0)) >> n) |
        ((x >> n) & (0xffffffffll << 32));
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT32(x >> 0, 0) | NZBIT32(x >> 32, 1);
    return x;
}